

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.cc
# Opt level: O0

bool __thiscall
tcmalloc::PageHeap::CheckList
          (PageHeap *this,Span *list,Length min_pages,Length max_pages,int freelist)

{
  LogItem b;
  LogItem b_00;
  LogItem b_01;
  LogItem b_02;
  LogItem b_03;
  LogItem c;
  LogItem c_00;
  LogItem c_01;
  LogItem c_02;
  LogItem c_03;
  LogItem d;
  LogItem d_00;
  LogItem d_01;
  LogItem d_02;
  LogItem d_03;
  LogItem a;
  LogItem a_00;
  LogItem a_01;
  LogItem a_02;
  LogItem a_03;
  LogItem local_1e8;
  LogItem local_1d8;
  LogItem local_1c8;
  LogItem local_1b8;
  LogItem local_1a8;
  LogItem local_198;
  LogItem local_188;
  LogItem local_178;
  LogItem local_168;
  LogItem local_158;
  LogItem local_148;
  LogItem local_138;
  LogItem local_128;
  LogItem local_118;
  LogItem local_108;
  LogItem local_f8;
  LogItem local_e8;
  LogItem local_d8;
  LogItem local_c8;
  LogItem local_b8;
  Span *local_a8;
  Span *s;
  Length LStack_98;
  int freelist_local;
  Length max_pages_local;
  Length min_pages_local;
  Span *list_local;
  PageHeap *this_local;
  PageHeap *local_70;
  ulong local_68;
  PageHeap *local_60;
  ulong local_58;
  Number i2;
  Number i1;
  PageMap *local_40;
  Span *local_38;
  ulong local_30;
  Number i2_1;
  Number i1_1;
  PageMap *local_18;
  Span *local_10;
  
  local_a8 = list->next;
  while( true ) {
    if (local_a8 == list) {
      return true;
    }
    s._4_4_ = freelist;
    LStack_98 = max_pages;
    max_pages_local = min_pages;
    min_pages_local = (Length)list;
    list_local = (Span *)this;
    if ((*(uint *)&local_a8->field_0x28 >> 0x18 & 3) != freelist) {
      LogItem::LogItem(&local_b8,"s->location == freelist");
      LogItem::LogItem(&local_c8);
      LogItem::LogItem(&local_d8);
      LogItem::LogItem(&local_e8);
      a._4_4_ = 0;
      a.tag_ = local_b8.tag_;
      b.u_.str = local_c8.u_.str;
      b.tag_ = local_c8.tag_;
      b._4_4_ = local_c8._4_4_;
      c.u_.str = local_d8.u_.str;
      c.tag_ = local_d8.tag_;
      c._4_4_ = local_d8._4_4_;
      d.u_.str = local_e8.u_.str;
      d.tag_ = local_e8.tag_;
      d._4_4_ = local_e8._4_4_;
      a.u_.str = local_b8.u_.str;
      Log(kCrash,
          "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/page_heap.cc"
          ,0x32a,a,b,c,d);
      do {
      } while( true );
    }
    if (local_a8->length < min_pages) {
      LogItem::LogItem(&local_f8,"s->length >= min_pages");
      LogItem::LogItem(&local_108);
      LogItem::LogItem(&local_118);
      LogItem::LogItem(&local_128);
      a_00._4_4_ = 0;
      a_00.tag_ = local_f8.tag_;
      b_00.u_.str = local_108.u_.str;
      b_00.tag_ = local_108.tag_;
      b_00._4_4_ = local_108._4_4_;
      c_00.u_.str = local_118.u_.str;
      c_00.tag_ = local_118.tag_;
      c_00._4_4_ = local_118._4_4_;
      d_00.u_.str = local_128.u_.str;
      d_00.tag_ = local_128.tag_;
      d_00._4_4_ = local_128._4_4_;
      a_00.u_.str = local_f8.u_.str;
      Log(kCrash,
          "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/page_heap.cc"
          ,0x32b,a_00,b_00,c_00,d_00);
      do {
      } while( true );
    }
    if (max_pages < local_a8->length) break;
    local_68 = local_a8->start;
    local_40 = &this->pagemap_;
    i2 = local_68 >> 0x12;
    local_58 = local_68 & 0x3ffff;
    if ((local_68 >> 0x23 == 0) && (local_40->root_[i2] != (Leaf *)0x0)) {
      local_38 = (Span *)local_40->root_[i2]->values[local_58];
    }
    else {
      local_38 = (Span *)0x0;
    }
    local_60 = this;
    i1 = local_68;
    if (local_38 != local_a8) {
      LogItem::LogItem(&local_178,"GetDescriptor(s->start) == s");
      LogItem::LogItem(&local_188);
      LogItem::LogItem(&local_198);
      LogItem::LogItem(&local_1a8);
      a_02._4_4_ = 0;
      a_02.tag_ = local_178.tag_;
      b_02.u_.str = local_188.u_.str;
      b_02.tag_ = local_188.tag_;
      b_02._4_4_ = local_188._4_4_;
      c_02.u_.str = local_198.u_.str;
      c_02.tag_ = local_198.tag_;
      c_02._4_4_ = local_198._4_4_;
      d_02.u_.str = local_1a8.u_.str;
      d_02.tag_ = local_1a8.tag_;
      d_02._4_4_ = local_1a8._4_4_;
      a_02.u_.str = local_178.u_.str;
      Log(kCrash,
          "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/page_heap.cc"
          ,0x32d,a_02,b_02,c_02,d_02);
      do {
      } while( true );
    }
    this_local = (PageHeap *)((local_a8->start + local_a8->length) - 1);
    local_18 = &this->pagemap_;
    i2_1 = (ulong)this_local >> 0x12;
    local_30 = (ulong)this_local & 0x3ffff;
    if (((ulong)this_local >> 0x23 == 0) && (local_18->root_[i2_1] != (Leaf *)0x0)) {
      local_10 = (Span *)local_18->root_[i2_1]->values[local_30];
    }
    else {
      local_10 = (Span *)0x0;
    }
    local_70 = this;
    i1_1 = (Number)this_local;
    if (local_10 != local_a8) {
      LogItem::LogItem(&local_1b8,"GetDescriptor(s->start+s->length-1) == s");
      LogItem::LogItem(&local_1c8);
      LogItem::LogItem(&local_1d8);
      LogItem::LogItem(&local_1e8);
      a_03._4_4_ = 0;
      a_03.tag_ = local_1b8.tag_;
      b_03.u_.str = local_1c8.u_.str;
      b_03.tag_ = local_1c8.tag_;
      b_03._4_4_ = local_1c8._4_4_;
      c_03.u_.str = local_1d8.u_.str;
      c_03.tag_ = local_1d8.tag_;
      c_03._4_4_ = local_1d8._4_4_;
      d_03.u_.str = local_1e8.u_.str;
      d_03.tag_ = local_1e8.tag_;
      d_03._4_4_ = local_1e8._4_4_;
      a_03.u_.str = local_1b8.u_.str;
      Log(kCrash,
          "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/page_heap.cc"
          ,0x32e,a_03,b_03,c_03,d_03);
      do {
      } while( true );
    }
    local_a8 = local_a8->next;
  }
  LogItem::LogItem(&local_138,"s->length <= max_pages");
  LogItem::LogItem(&local_148);
  LogItem::LogItem(&local_158);
  LogItem::LogItem(&local_168);
  a_01._4_4_ = 0;
  a_01.tag_ = local_138.tag_;
  b_01.u_.str = local_148.u_.str;
  b_01.tag_ = local_148.tag_;
  b_01._4_4_ = local_148._4_4_;
  c_01.u_.str = local_158.u_.str;
  c_01.tag_ = local_158.tag_;
  c_01._4_4_ = local_158._4_4_;
  d_01.u_.str = local_168.u_.str;
  d_01.tag_ = local_168.tag_;
  d_01._4_4_ = local_168._4_4_;
  a_01.u_.str = local_138.u_.str;
  Log(kCrash,
      "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/page_heap.cc",
      0x32c,a_01,b_01,c_01,d_01);
  do {
  } while( true );
}

Assistant:

bool PageHeap::CheckList(Span* list, Length min_pages, Length max_pages,
                         int freelist) {
  for (Span* s = list->next; s != list; s = s->next) {
    CHECK_CONDITION(s->location == freelist);  // NORMAL or RETURNED
    CHECK_CONDITION(s->length >= min_pages);
    CHECK_CONDITION(s->length <= max_pages);
    CHECK_CONDITION(GetDescriptor(s->start) == s);
    CHECK_CONDITION(GetDescriptor(s->start+s->length-1) == s);
  }
  return true;
}